

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O3

void __thiscall
ipx::Crossover::PushPrimal
          (Crossover *this,Basis *basis,Vector *x,vector<int,_std::allocator<int>_> *variables,
          Vector *z,Info *info)

{
  ulong uVar1;
  double *pdVar2;
  bool *fixed_at_bound;
  ulong uVar3;
  
  uVar1 = z->_M_size;
  fixed_at_bound = (bool *)operator_new(uVar1);
  if (uVar1 != 0) {
    pdVar2 = z->_M_data;
    uVar3 = 0;
    do {
      fixed_at_bound[uVar3] = pdVar2[uVar3] != 0.0;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  PushPrimal(this,basis,x,variables,fixed_at_bound,info);
  operator_delete(fixed_at_bound);
  return;
}

Assistant:

void Crossover::PushPrimal(Basis* basis, Vector& x,
                           const std::vector<Int>& variables,
                           const Vector& z, Info* info) {
    std::valarray<bool> bound_restrict = z != 0.0;
    PushPrimal(basis, x, variables, &bound_restrict[0], info);
}